

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O3

void __thiscall QHeaderView::swapSections(QHeaderView *this,int first,int second)

{
  QHeaderViewPrivate *this_00;
  long lVar1;
  Data *pDVar2;
  SectionItem *pSVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  pointer piVar7;
  pointer pSVar8;
  uint uVar9;
  ulong uVar10;
  ResizeMode mode;
  ulong uVar11;
  uint sizePerSection;
  ResizeMode mode_00;
  long in_FS_OFFSET;
  int local_8c;
  int local_88;
  uint local_84;
  int local_64;
  int local_60;
  int local_5c;
  void *local_58;
  int *local_50;
  int *local_48;
  int *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (first == second) goto LAB_00549395;
  this_00 = *(QHeaderViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
     ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this_00->super_QAbstractItemViewPrivate);
    (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                             super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                             super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  if (first < 0) goto LAB_00549395;
  if (this_00->headerMode == InitialNoSectionMemoryUsage) {
    uVar9 = (uint)this_00->countInNoSectionItemsMode;
    if (((int)uVar9 <= first || second < 0) || uVar9 <= (uint)second) goto LAB_00549395;
    QHeaderViewPrivate::setHeaderMode(this_00,FlexibleWithSectionMemoryUsage);
    if (this_00->headerMode != InitialNoSectionMemoryUsage) goto LAB_005490da;
    uVar9 = this_00->defaultSectionSize;
    uVar6 = (this_00->sectionItems).d.size;
    bVar4 = true;
  }
  else {
    uVar9 = (uint)(this_00->sectionItems).d.size;
    if (((int)uVar9 <= first || second < 0) || uVar9 <= (uint)second) goto LAB_00549395;
LAB_005490da:
    uVar6 = (this_00->sectionItems).d.size;
    if (first < (int)uVar6) {
      uVar9 = *(uint *)((this_00->sectionItems).d.ptr + (uint)first) & 0xfffff;
    }
    else {
      uVar9 = 0xffffffff;
    }
    bVar4 = false;
  }
  uVar11 = (ulong)(uint)first;
  if (uVar11 < uVar6) {
    mode = *(uint *)((this_00->sectionItems).d.ptr + uVar11) >> 0x15 & 0x1f;
  }
  else {
    mode = this_00->globalResizeMode;
  }
  lVar1 = (this_00->logicalIndices).d.size;
  local_88 = first;
  if (lVar1 != 0) {
    local_88 = (this_00->logicalIndices).d.ptr[uVar11];
  }
  uVar10 = (ulong)(uint)second;
  if (bVar4) {
    sizePerSection = this_00->defaultSectionSize;
  }
  else {
    sizePerSection = 0xffffffff;
    if (second < (int)uVar6) {
      sizePerSection = *(uint *)((this_00->sectionItems).d.ptr + uVar10) & 0xfffff;
    }
  }
  if (uVar10 < uVar6) {
    mode_00 = *(uint *)((this_00->sectionItems).d.ptr + uVar10) >> 0x15 & 0x1f;
  }
  else {
    mode_00 = this_00->globalResizeMode;
  }
  local_8c = second;
  if (lVar1 != 0) {
    local_8c = (this_00->logicalIndices).d.ptr[uVar10];
  }
  if (this_00->state == ResizeSection) {
    this_00->preventCursorChangeInSetOffset = true;
  }
  QHeaderViewPrivate::createSectionItems(this_00,second,second,uVar9,mode);
  QHeaderViewPrivate::createSectionItems(this_00,first,first,sizePerSection,mode_00);
  QHeaderViewPrivate::initializeIndexMapping(this_00);
  piVar7 = QList<int>::data(&this_00->visualIndices);
  piVar7[local_88] = second;
  piVar7 = QList<int>::data(&this_00->logicalIndices);
  piVar7[uVar10] = local_88;
  piVar7 = QList<int>::data(&this_00->visualIndices);
  piVar7[local_8c] = first;
  piVar7 = QList<int>::data(&this_00->logicalIndices);
  piVar7[uVar11] = local_8c;
  pDVar2 = (this_00->hiddenSectionSize).d;
  if ((pDVar2 != (Data *)0x0) && (pDVar2->size != 0)) {
    if (this_00->headerMode == InitialNoSectionMemoryUsage) {
      local_84 = 0;
      uVar9 = 0;
    }
    else {
      pSVar3 = (this_00->sectionItems).d.ptr;
      local_84 = *(uint *)(pSVar3 + uVar11) & 0x100000;
      uVar9 = *(uint *)(pSVar3 + uVar10) & 0x100000;
    }
    pSVar8 = QList<QHeaderViewPrivate::SectionItem>::data(&this_00->sectionItems);
    *(uint *)(pSVar8 + uVar11) = *(uint *)(pSVar8 + uVar11) & 0xffefffff | uVar9;
    pSVar8 = QList<QHeaderViewPrivate::SectionItem>::data(&this_00->sectionItems);
    *(uint *)(pSVar8 + uVar10) = *(uint *)(pSVar8 + uVar10) & 0xffefffff | local_84;
  }
  QWidget::update((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                  viewport);
  local_50 = &local_5c;
  local_5c = local_88;
  local_48 = &local_60;
  local_58 = (void *)0x0;
  local_64 = second;
  local_60 = first;
  local_40 = &local_64;
  QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_58);
  local_50 = &local_5c;
  local_5c = local_8c;
  local_48 = &local_60;
  local_58 = (void *)0x0;
  local_64 = first;
  local_60 = second;
  local_40 = &local_64;
  QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_58);
  if ((*(char *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget.field_0x8 + 0x5ec) == '\x01') &&
     (iVar5 = visualIndex(this,this_00->lastSectionLogicalIdx), iVar5 <= first || iVar5 <= second))
  {
    QHeaderViewPrivate::maybeRestorePrevLastSectionAndStretchLast(this_00);
  }
LAB_00549395:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHeaderView::swapSections(int first, int second)
{
    Q_D(QHeaderView);

    if (first == second)
        return;
    d->executePostedLayout();
    if (first < 0 || first >= d->sectionCount() || second < 0 || second >= d->sectionCount())
        return;

    if (d->noSectionMemoryUsage())
        d->switchToFlexibleModeWithSectionMemoryUsage();

    int firstSize = d->headerSectionSize(first);
    ResizeMode firstMode = d->headerSectionResizeMode(first);
    int firstLogical = d->logicalIndex(first);

    int secondSize = d->headerSectionSize(second);
    ResizeMode secondMode = d->headerSectionResizeMode(second);
    int secondLogical = d->logicalIndex(second);

    if (d->state == QHeaderViewPrivate::ResizeSection)
        d->preventCursorChangeInSetOffset = true;

    d->createSectionItems(second, second, firstSize, firstMode);
    d->createSectionItems(first, first, secondSize, secondMode);

    d->initializeIndexMapping();

    d->visualIndices[firstLogical] = second;
    d->logicalIndices[second] = firstLogical;

    d->visualIndices[secondLogical] = first;
    d->logicalIndices[first] = secondLogical;

    if (!d->hiddenSectionSize.isEmpty()) {
        bool firstHidden = d->isVisualIndexHidden(first);
        bool secondHidden = d->isVisualIndexHidden(second);
        d->setVisualIndexHidden(first, secondHidden);
        d->setVisualIndexHidden(second, firstHidden);
    }

    d->viewport->update();
    emit sectionMoved(firstLogical, first, second);
    emit sectionMoved(secondLogical, second, first);

    if (stretchLastSection()) {
        const int lastSectionVisualIdx = visualIndex(d->lastSectionLogicalIdx);
        if (first >= lastSectionVisualIdx || second >= lastSectionVisualIdx)
            d->maybeRestorePrevLastSectionAndStretchLast();
    }
}